

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O1

TableOfContentsNode * __thiscall
soul::findOrCreateNode
          (soul *this,TableOfContentsNode *node,
          ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  soul *psVar3;
  int iVar4;
  TableOfContentsNode *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  TableOfContentsNode *c;
  soul *this_01;
  bool bVar6;
  bool bVar7;
  ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  path_00;
  ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  path_01;
  TableOfContentsNode local_78;
  
  pbVar5 = path.e;
  path_00.s = (TableOfContentsNode *)path.s;
  this_00 = (TableOfContentsNode *)this;
  if ((node != path_00.s) &&
     ((((long)path_00.s - (long)node != 0x20 ||
       (sVar2 = (node->name)._M_string_length, sVar2 != *(size_t *)(this + 8))) ||
      ((sVar2 != 0 && (iVar4 = bcmp((node->name)._M_dataplus._M_p,*(void **)this,sVar2), iVar4 != 0)
       ))))) {
    this_01 = *(soul **)(this + 0x20);
    psVar3 = *(soul **)(this + 0x28);
    bVar6 = this_01 == psVar3;
    if (!bVar6) {
      do {
        sVar2 = (node->name)._M_string_length;
        if (sVar2 == *(size_t *)(this_01 + 8)) {
          if (sVar2 == 0) {
            bVar7 = true;
          }
          else {
            iVar4 = bcmp((node->name)._M_dataplus._M_p,*(void **)this_01,sVar2);
            bVar7 = iVar4 == 0;
          }
        }
        else {
          bVar7 = false;
        }
        if (bVar7) {
          path_00.e = pbVar5;
          this_00 = findOrCreateNode(this_01,(TableOfContentsNode *)&node->children,path_00);
          break;
        }
        this_01 = this_01 + 0x48;
        bVar6 = this_01 == psVar3;
      } while (!bVar6);
    }
    if (bVar6) {
      paVar1 = &local_78.name.field_2;
      local_78.name._M_string_length = 0;
      local_78.name.field_2._M_local_buf[0] = '\0';
      local_78.children.
      super__Vector_base<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.children.
      super__Vector_base<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.children.
      super__Vector_base<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78.module = (Module *)0x0;
      local_78.file = (File *)0x0;
      local_78.name._M_dataplus._M_p = (pointer)paVar1;
      std::
      vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
      ::emplace_back<soul::SourceCodeModel::TableOfContentsNode>
                ((vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
                  *)(this + 0x20),&local_78);
      std::
      vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
      ::~vector(&local_78.children);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.name._M_dataplus._M_p != paVar1) {
        operator_delete(local_78.name._M_dataplus._M_p,
                        CONCAT71(local_78.name.field_2._M_allocated_capacity._1_7_,
                                 local_78.name.field_2._M_local_buf[0]) + 1);
      }
      this_00 = (TableOfContentsNode *)(*(long *)(this + 0x28) + -0x48);
      std::__cxx11::string::_M_assign((string *)this_00);
      if (0x20 < (ulong)((long)path_00.s - (long)node)) {
        path_01.e = pbVar5;
        path_01.s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)path_00.s;
        this_00 = findOrCreateNode((soul *)this_00,(TableOfContentsNode *)&node->children,path_01);
      }
    }
  }
  return this_00;
}

Assistant:

static SourceCodeModel::TableOfContentsNode& findOrCreateNode (SourceCodeModel::TableOfContentsNode& node,
                                                               ArrayView<std::string> path)
{
    if (path.empty())
        return node;

    auto& firstPart = path.front();

    if (path.size() == 1 && firstPart == node.name)
        return node;

    for (auto& c : node.children)
        if (firstPart == c.name)
            return findOrCreateNode (c, path.tail());

    node.children.push_back ({});
    auto& n = node.children.back();
    n.name = firstPart;
    return path.size() > 1 ? findOrCreateNode (n, path.tail()) : n;
}